

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O3

Pdr_Set_t * Txs3_ManTernarySim(Txs3_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t **ppVVar1;
  Vec_Int_t **ppVVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Pdr_Man_t *pPVar5;
  Vec_Ptr_t *pVVar6;
  lit *begin;
  void *pvVar7;
  Aig_Man_t *pAVar8;
  Vec_Int_t **ppVVar9;
  int iVar10;
  int iVar11;
  sat_solver *s;
  Vec_Int_t *pVVar12;
  int *piVar13;
  void **ppvVar14;
  ulong uVar15;
  Pdr_Set_t *pCube_00;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  Vec_Int_t *pVVar20;
  ulong uVar21;
  Aig_Obj_t *pObj;
  long lVar22;
  
  pVVar12 = p->vCoObjs;
  pVVar12->nSize = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar10 = p->pMan->iOutCur;
    if ((long)iVar10 < 0) {
LAB_005f8ef6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pVVar20 = p->pGia->vCos;
    if (pVVar20->nSize <= iVar10) goto LAB_005f8ef6;
    iVar10 = pVVar20->pArray[iVar10];
    if ((iVar10 < 0) || (p->pGia->nObjs <= iVar10)) {
LAB_005f8fb0:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    Vec_IntPush(pVVar12,iVar10);
  }
  else {
    iVar10 = pCube->nLits;
    if (0 < iVar10) {
      lVar18 = 0;
      do {
        uVar16 = *(uint *)(&pCube->field_0x14 + lVar18 * 4);
        if (uVar16 != 0xffffffff) {
          if ((int)uVar16 < 0) goto LAB_005f8f34;
          pGVar4 = p->pGia;
          iVar10 = pGVar4->vCos->nSize;
          uVar16 = (uVar16 >> 1) + (iVar10 - pGVar4->nRegs);
          if (((int)uVar16 < 0) || (iVar10 <= (int)uVar16)) goto LAB_005f8ef6;
          iVar10 = pGVar4->vCos->pArray[uVar16];
          if ((iVar10 < 0) || (pGVar4->nObjs <= iVar10)) goto LAB_005f8fb0;
          Vec_IntPush(p->vCoObjs,iVar10);
          iVar10 = pCube->nLits;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar10);
    }
  }
  Txs3_ManCollectCone(p,0);
  Pdr_ManCollectValues(p->pMan,k,p->vCiObjs,p->vCiVals);
  Pdr_ManCollectValues(p->pMan,k,p->vCoObjs,p->vCoVals);
  s = Pdr_ManFetchSolver(p->pMan,k);
  iVar10 = Pdr_ManFreeVar(p->pMan,k);
  if (iVar10 < 0) {
LAB_005f8fcf:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  pPVar5 = p->pMan;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar11 = pPVar5->iOutCur;
    if (((long)iVar11 < 0) || (pVVar6 = pPVar5->pAig->vCos, pVVar6->nSize <= iVar11))
    goto LAB_005f8f15;
    pVVar12 = pPVar5->vLits;
    iVar11 = Pdr_ObjSatVar(pPVar5,k,2,(Aig_Obj_t *)pVVar6->pArray[iVar11]);
    if (iVar11 < 0) goto LAB_005f8fcf;
    piVar13 = pVVar12->pArray;
    if (pVVar12->nCap < 1) {
      if (piVar13 == (int *)0x0) {
        piVar13 = (int *)malloc(4);
      }
      else {
        piVar13 = (int *)realloc(piVar13,4);
      }
      pVVar12->pArray = piVar13;
      if (piVar13 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar12->nCap = 1;
    }
    *piVar13 = iVar11 * 2 + 1;
    pVVar12->nSize = 1;
  }
  else {
    pVVar12 = Pdr_ManCubeToLits(pPVar5,k,pCube,1,1);
  }
  Vec_IntPush(pVVar12,iVar10 * 2);
  iVar11 = sat_solver_addclause(s,pVVar12->pArray,pVVar12->pArray + pVVar12->nSize);
  if (iVar11 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                  ,0xf9,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  if ((s->qtail != s->qhead) && (iVar11 = sat_solver_simplify(s), iVar11 == 0)) {
    __assert_fail("RetValue != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x102,"void sat_solver_compress(sat_solver *)");
  }
  pVVar12 = p->vTemp;
  pVVar12->nSize = 0;
  uVar16 = iVar10 * 2 | 1;
  Vec_IntPush(pVVar12,uVar16);
  pVVar12 = p->vCiObjs;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      if (p->vCiVals->nSize <= lVar18) goto LAB_005f8ef6;
      iVar10 = p->vCiVals->pArray[lVar18];
      pVVar6 = p->pMan->pAig->vObjs;
      if (pVVar6 == (Vec_Ptr_t *)0x0) {
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        uVar17 = pVVar12->pArray[lVar18];
        if (((int)uVar17 < 0) || (pVVar6->nSize <= (int)uVar17)) goto LAB_005f8f15;
        pObj = (Aig_Obj_t *)pVVar6->pArray[uVar17];
      }
      iVar11 = Pdr_ObjSatVar(p->pMan,k,3,pObj);
      if (iVar11 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                      ,0x104,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
      }
      if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                      ,0x105,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
      }
      Vec_IntPush(p->vTemp,(uint)(iVar10 == 0) + iVar11 * 2);
      lVar18 = lVar18 + 1;
      pVVar12 = p->vCiObjs;
    } while (lVar18 < pVVar12->nSize);
  }
  begin = p->vTemp->pArray;
  iVar10 = sat_solver_solve(s,begin,begin + p->vTemp->nSize,0,0,0,0);
  if (iVar10 != -1) {
    __assert_fail("RetValue == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                  ,0x126,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  lVar18 = (long)(s->conf_final).size;
  piVar13 = (s->conf_final).ptr;
  p->vTemp->nSize = 0;
  if (0 < lVar18) {
    lVar22 = 0;
    do {
      uVar17 = piVar13[lVar22];
      if ((int)uVar17 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      Vec_IntPush(p->vTemp,uVar17 ^ 1);
      lVar22 = lVar22 + 1;
    } while (lVar18 != lVar22);
    iVar10 = p->vTemp->nSize;
    if (1 < (long)iVar10) {
      piVar13 = p->vTemp->pArray;
      lVar18 = 1;
      uVar15 = 0;
      do {
        uVar21 = uVar15 & 0xffffffff;
        lVar22 = lVar18;
        do {
          uVar17 = (uint)lVar22;
          if (piVar13[(int)(uint)uVar21] <= piVar13[lVar22]) {
            uVar17 = (uint)uVar21;
          }
          lVar22 = lVar22 + 1;
          uVar21 = (ulong)uVar17;
        } while (iVar10 != lVar22);
        iVar11 = piVar13[uVar15];
        piVar13[uVar15] = piVar13[(int)uVar17];
        uVar15 = uVar15 + 1;
        piVar13[(int)uVar17] = iVar11;
        lVar18 = lVar18 + 1;
      } while (uVar15 != iVar10 - 1);
    }
  }
  p->vPiLits->nSize = 0;
  p->vFfLits->nSize = 0;
  pPVar5 = p->pMan;
  iVar10 = (pPVar5->vVar2Ids).nSize;
  if (iVar10 <= k) {
    iVar19 = k + 1;
    iVar11 = (pPVar5->vVar2Ids).nCap;
    if (k < iVar11 * 2) {
      if (iVar11 <= k) {
        ppvVar14 = (pPVar5->vVar2Ids).pArray;
        if (ppvVar14 == (void **)0x0) {
          ppvVar14 = (void **)malloc((long)iVar11 << 4);
        }
        else {
          ppvVar14 = (void **)realloc(ppvVar14,(long)iVar11 << 4);
        }
        (pPVar5->vVar2Ids).pArray = ppvVar14;
        iVar10 = iVar11 * 2;
LAB_005f8ce8:
        (pPVar5->vVar2Ids).nCap = iVar10;
        iVar10 = (pPVar5->vVar2Ids).nSize;
      }
    }
    else if (iVar11 <= k) {
      ppvVar14 = (pPVar5->vVar2Ids).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc((long)iVar19 << 3);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,(long)iVar19 << 3);
      }
      (pPVar5->vVar2Ids).pArray = ppvVar14;
      iVar10 = iVar19;
      goto LAB_005f8ce8;
    }
    if (iVar10 <= k) {
      lVar18 = (long)iVar10;
      do {
        (pPVar5->vVar2Ids).pArray[lVar18] = (void *)0x0;
        lVar18 = lVar18 + 1;
      } while (iVar19 != lVar18);
    }
    (pPVar5->vVar2Ids).nSize = iVar19;
    iVar10 = iVar19;
  }
  if ((-1 < k) && (k < iVar10)) {
    ppVVar1 = &p->vPiLits;
    ppVVar2 = &p->vFfLits;
    pVVar12 = p->vTemp;
    iVar10 = pVVar12->nSize;
    if (0 < iVar10) {
      pvVar7 = (pPVar5->vVar2Ids).pArray[(uint)k];
      lVar18 = 0;
      do {
        uVar17 = pVVar12->pArray[lVar18];
        if (uVar17 != uVar16) {
          if ((int)uVar17 < 0) goto LAB_005f8f34;
          if (*(int *)((long)pvVar7 + 4) <= (int)(uVar17 >> 1)) goto LAB_005f8ef6;
          pAVar8 = p->pMan->pAig;
          pVVar6 = pAVar8->vObjs;
          if (pVVar6 == (Vec_Ptr_t *)0x0) {
            piVar13 = (int *)0x0;
          }
          else {
            uVar3 = *(uint *)(*(long *)((long)pvVar7 + 8) + (ulong)(uVar17 >> 1) * 4);
            if (((int)uVar3 < 0) || (pVVar6->nSize <= (int)uVar3)) goto LAB_005f8f15;
            piVar13 = (int *)pVVar6->pArray[uVar3];
          }
          if ((piVar13[6] & 7U) != 2) {
            __assert_fail("Aig_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                          ,0x13e,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
          }
          iVar10 = *piVar13;
          iVar11 = pAVar8->nTruePis;
          iVar19 = iVar10 - iVar11;
          ppVVar9 = ppVVar2;
          if (iVar10 < iVar11) {
            ppVVar9 = ppVVar1;
            iVar19 = iVar10;
          }
          if (iVar19 < 0) goto LAB_005f8fcf;
          Vec_IntPush(*ppVVar9,(uVar17 & 1) + iVar19 * 2);
        }
        lVar18 = lVar18 + 1;
        pVVar12 = p->vTemp;
        iVar10 = pVVar12->nSize;
      } while (lVar18 < iVar10);
    }
    pVVar12 = *ppVVar1;
    pVVar20 = *ppVVar2;
    uVar16 = pVVar20->nSize;
    uVar15 = (ulong)uVar16;
    if (iVar10 != pVVar12->nSize + uVar16 + 1) {
      __assert_fail("Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                    ,0x145,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    if ((p->pMan->pPars->fUseAbs != 0) && (p->pMan->vAbsFlops != (Vec_Int_t *)0x0)) {
      if ((int)uVar16 < 1) {
        uVar17 = 0;
      }
      else {
        lVar18 = 0;
        uVar17 = 0;
        do {
          uVar16 = pVVar20->pArray[lVar18];
          if ((int)uVar16 < 0) {
LAB_005f8f34:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pVVar12 = p->pMan->vAbsFlops;
          if (pVVar12->nSize <= (int)(uVar16 >> 1)) goto LAB_005f8ef6;
          if (pVVar12->pArray[uVar16 >> 1] == 0) {
            Vec_IntPush(*ppVVar1,uVar16 + p->pMan->pAig->nTruePis * 2);
            pVVar20 = *ppVVar2;
          }
          else {
            if (((int)uVar17 < 0) || ((uint)uVar15 <= uVar17)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar15 = (ulong)uVar17;
            uVar17 = uVar17 + 1;
            pVVar20->pArray[uVar15] = uVar16;
          }
          lVar18 = lVar18 + 1;
          uVar16 = pVVar20->nSize;
          uVar15 = (ulong)(int)uVar16;
        } while (lVar18 < (long)uVar15);
      }
      if ((int)uVar16 < (int)uVar17) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar20->nSize = uVar17;
      pVVar12 = *ppVVar1;
    }
    pCube_00 = Pdr_SetCreate(pVVar20,pVVar12);
    if ((k != 0) && (iVar10 = Pdr_SetIsInit(pCube_00,-1), iVar10 != 0)) {
      __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                    ,0x160,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    return pCube_00;
  }
LAB_005f8f15:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Pdr_Set_t * Txs3_ManTernarySim( Txs3_Man_t * p, int k, Pdr_Set_t * pCube )
{
//    int fTryNew = 1;
//    int fUseLit = 1;
    int fVerbose = 0;
    sat_solver * pSat;
    Pdr_Set_t * pRes;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVar2Ids, * vLits;
    int i, Lit, LitAux, Var, Value, RetValue, nCoreLits, * pCoreLits;//, nLits;
//    if ( k == 0 )
//        fVerbose = 1;
    // collect CO objects
    Vec_IntClear( p->vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
        pObj = Gia_ManCo(p->pGia, p->pMan->iOutCur);
        Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
    }
    else // the target is the cube
    {
        int i;
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Gia_ManCo(p->pGia, Gia_ManPoNum(p->pGia) + Abc_Lit2Var(pCube->Lits[i]));
            Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
        }
    }
if ( 0 )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Gia_ManRegNum(p->pGia), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Txs3_ManCollectCone( p, fVerbose );
    // collect values
    Pdr_ManCollectValues( p->pMan, k, p->vCiObjs, p->vCiVals );
    Pdr_ManCollectValues( p->pMan, k, p->vCoObjs, p->vCoVals );

    // read solver
    pSat = Pdr_ManFetchSolver( p->pMan, k );
    LitAux = Abc_Var2Lit( Pdr_ManFreeVar(p->pMan, k), 0 );
    // add the clause (complemented cube) in terms of next state variables
    if ( pCube == NULL ) // the target is the property output
    {
        vLits = p->pMan->vLits;
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p->pMan, k, 2, Aig_ManCo(p->pMan->pAig, p->pMan->iOutCur)), 1 ); // neg literal (property holds)
        Vec_IntFill( vLits, 1, Lit );
    }
    else
        vLits = Pdr_ManCubeToLits( p->pMan, k, pCube, 1, 1 );
    // add activation literal
    Vec_IntPush( vLits, LitAux );
    RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
    assert( RetValue == 1 );
    sat_solver_compress( pSat );

    // collect assumptions 
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, Abc_LitNot(LitAux) );
    // iterate through the values of the CI variables
    Vec_IntForEachEntryTwo( p->vCiObjs, p->vCiVals, Var, Value, i )
    {
        Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Var );
//        iVar = Pdr_ObjSatVar( p->pMan, k, fNext ? 2 - lit_sign(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        int iVar = Pdr_ObjSatVar( p->pMan, k, 3, pObj ); assert( iVar >= 0 );
        assert( Aig_ObjIsCi(pObj) );
        Vec_IntPush( p->vTemp, Abc_Var2Lit(iVar, !Value) );
    }
    if ( fVerbose )
    {
        printf( "Clause with %d lits on lev %d\n", pCube ? pCube->nLits : 0, k );
        Vec_IntPrint( p->vTemp );
    }

/*
    // solve with assumptions
//printf( "%d -> ", Vec_IntSize(p->vTemp) );
{
abctime clk = Abc_Clock();
// assume all except flops
    Vec_IntForEachEntryStop( p->vTemp, Lit, i, p->nPiLits + 1 )
        if ( !sat_solver_push(pSat, Lit) )
        {
            assert( 0 );
        }
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(p->vTemp) + p->nPiLits + 1, Vec_IntSize(p->vTemp) - p->nPiLits - 1, p->pMan->pPars->nConfLimit );
    Vec_IntShrink( p->vTemp, p->nPiLits + 1 + nLits );

p->pMan->tAbs += Abc_Clock() - clk;
    for ( i = 0; i <= p->nPiLits; i++ )
        sat_solver_pop(pSat);
}
//printf( "%d    ", nLits );
*/


    //check one last time
    RetValue = sat_solver_solve( pSat, Vec_IntArray(p->vTemp), Vec_IntLimit(p->vTemp), 0, 0, 0, 0 );
    assert( RetValue == l_False );

    // use analyze final
    nCoreLits = sat_solver_final(pSat, &pCoreLits);
    //assert( Vec_IntSize(p->vTemp) <= nCoreLits );

    Vec_IntClear( p->vTemp );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( p->vTemp, Abc_LitNot(pCoreLits[i]) );
    Vec_IntSelectSort( Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp) );

    if ( fVerbose )
        Vec_IntPrint( p->vTemp );

    // collect the resulting sets
    Vec_IntClear( p->vPiLits );
    Vec_IntClear( p->vFfLits );
    vVar2Ids = (Vec_Int_t *)Vec_PtrGetEntry( &p->pMan->vVar2Ids, k );
    Vec_IntForEachEntry( p->vTemp, Lit, i )
    {
        if ( Lit != Abc_LitNot(LitAux) )
        {
            int Id = Vec_IntEntry( vVar2Ids, Abc_Lit2Var(Lit) );
            Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Id );
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(p->pMan->pAig, pObj) )
                Vec_IntPush( p->vPiLits, Abc_Var2Lit(Aig_ObjCioId(pObj), Abc_LitIsCompl(Lit)) );
            else
                Vec_IntPush( p->vFfLits, Abc_Var2Lit(Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pMan->pAig), Abc_LitIsCompl(Lit)) );
        }
    }
    assert( Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1 );

    // move abstracted literals from flops to inputs
    if ( p->pMan->pPars->fUseAbs && p->pMan->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( p->vFfLits, iLit, i )
        {
            if ( Vec_IntEntry(p->pMan->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( p->vFfLits, k++, iLit );
            else
                Vec_IntPush( p->vPiLits, 2*Saig_ManPiNum(p->pMan->pAig) + iLit );
        }
        Vec_IntShrink( p->vFfLits, k );
    }

    if ( fVerbose )
        Vec_IntPrint( p->vPiLits );
    if ( fVerbose )
        Vec_IntPrint( p->vFfLits );
    if ( fVerbose )
        printf( "\n" );

    // derive the final set
    pRes = Pdr_SetCreate( p->vFfLits, p->vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}